

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

int Ssc_GiaCountCaresSim(Gia_Man_t *p)

{
  int iVar1;
  word *pSim;
  
  pSim = Ssc_GiaGetCareMask(p);
  iVar1 = Ssc_SimCountBits(pSim,p->vSimsPi->nSize / (p->vCis->nSize - p->nRegs));
  free(pSim);
  return iVar1;
}

Assistant:

int Ssc_GiaCountCaresSim( Gia_Man_t * p )
{
    word * pRes = Ssc_GiaGetCareMask( p );
    int nWords = Gia_ObjSimWords( p );
    int Count = Ssc_SimCountBits( pRes, nWords );
    ABC_FREE( pRes );
    return Count;
}